

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase1395::run(TestCase1395 *this)

{
  SourceLocation location;
  bool bVar1;
  int iVar2;
  PromiseFulfiller<void> *pPVar3;
  nfds_t __nfds;
  nfds_t __nfds_00;
  undefined8 in_stack_fffffffffffffe60;
  Promise<void> *this_00;
  SourceLocation local_160;
  Fault local_148;
  Fault f_1;
  SourceLocation local_138;
  bool local_11b;
  DebugExpression<bool> local_11a;
  undefined1 local_119;
  DebugExpression<bool> _kjCondition_1;
  Fault f;
  SourceLocation local_108;
  bool local_eb;
  DebugExpression<bool> local_ea [2];
  undefined1 auStack_e8 [6];
  DebugExpression<bool> _kjCondition;
  char *pcStack_e0;
  undefined8 local_d8;
  undefined1 local_d0 [8];
  PromiseFulfillerPair<void> paf;
  undefined1 local_a8 [8];
  WaitScope waitScope;
  EventLoop loop;
  TestCase1395 *this_local;
  
  EventLoop::EventLoop((EventLoop *)&waitScope.runningStacksPool);
  WaitScope::WaitScope((WaitScope *)local_a8,(EventLoop *)&waitScope.runningStacksPool);
  SourceLocation::SourceLocation
            ((SourceLocation *)auStack_e8,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
             ,"run",0x577,0xe);
  location.function = (char *)local_d8;
  location.fileName = pcStack_e0;
  location.lineNumber = (int)in_stack_fffffffffffffe60;
  location.columnNumber = (int)((ulong)in_stack_fffffffffffffe60 >> 0x20);
  newPromiseAndFulfiller<void>(location);
  SourceLocation::SourceLocation
            (&local_108,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
             ,"run",0x578,0x29);
  iVar2 = Promise<void>::poll((Promise<void> *)local_d0,(pollfd *)local_a8,__nfds,
                              local_108.lineNumber);
  local_eb = (bool)(~(byte)iVar2 & 1);
  local_ea[0] = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_eb);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)local_ea);
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
              ((Fault *)&stack0xfffffffffffffee8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x578,FAILED,"!paf.promise.poll(waitScope)","_kjCondition,",local_ea);
    kj::_::Debug::Fault::fatal((Fault *)&stack0xfffffffffffffee8);
  }
  pPVar3 = Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::operator->
                     ((Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)&paf);
  (*(pPVar3->super_PromiseRejector)._vptr_PromiseRejector[2])(pPVar3,&local_119);
  SourceLocation::SourceLocation
            (&local_138,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
             ,"run",0x57a,0x28);
  iVar2 = Promise<void>::poll((Promise<void> *)local_d0,(pollfd *)local_a8,__nfds_00,
                              local_138.lineNumber);
  local_11b = (bool)((byte)iVar2 & 1);
  local_11a = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_11b);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_11a);
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
              (&local_148,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x57a,FAILED,"paf.promise.poll(waitScope)","_kjCondition,",&local_11a);
    kj::_::Debug::Fault::fatal(&local_148);
  }
  this_00 = (Promise<void> *)local_d0;
  SourceLocation::SourceLocation
            (&local_160,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
             ,"run",0x57b,3);
  Promise<void>::wait(this_00,local_a8);
  PromiseFulfillerPair<void>::~PromiseFulfillerPair((PromiseFulfillerPair<void> *)local_d0);
  WaitScope::~WaitScope((WaitScope *)local_a8);
  EventLoop::~EventLoop((EventLoop *)&waitScope.runningStacksPool);
  return;
}

Assistant:

TEST(Async, Poll) {
  EventLoop loop;
  WaitScope waitScope(loop);

  auto paf = newPromiseAndFulfiller<void>();
  KJ_ASSERT(!paf.promise.poll(waitScope));
  paf.fulfiller->fulfill();
  KJ_ASSERT(paf.promise.poll(waitScope));
  paf.promise.wait(waitScope);
}